

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  char cVar1;
  uint uVar2;
  sqlite3_index_constraint *psVar3;
  sqlite3_index_constraint_usage *psVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  char *__dest;
  ulong uVar8;
  undefined1 uVar9;
  long lVar10;
  uchar uVar11;
  long lVar12;
  int iVar13;
  long in_FS_OFFSET;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined1 uStack_50;
  undefined7 local_4f;
  undefined1 uStack_48;
  undefined8 uStack_47;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_48 = 0;
  uStack_47 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  local_4f = 0;
  local_68 = 0;
  uStack_60 = 0;
  uVar2 = pIdxInfo->nConstraint;
  lVar7 = 0;
  uVar8 = 0;
  if (0 < (int)uVar2) {
    uVar8 = (ulong)uVar2;
  }
  bVar5 = false;
  for (; uVar8 * 0xc - lVar7 != 0; lVar7 = lVar7 + 0xc) {
    if ((&pIdxInfo->aConstraint->op)[lVar7] == '@') {
      bVar5 = true;
    }
  }
  lVar10 = 0;
  lVar7 = 5;
  iVar13 = 0;
  while ((lVar10 < (int)uVar2 && (iVar13 < 0x28))) {
    psVar3 = pIdxInfo->aConstraint;
    cVar1 = *(char *)((long)&psVar3->iColumn + lVar7);
    if (!bVar5) {
      if (cVar1 == '\0') goto LAB_001d9023;
      uVar6 = *(uint *)((long)psVar3 + lVar7 + -5);
      if (0 < (int)uVar6) goto LAB_001d8f96;
      if (*(char *)((long)psVar3 + lVar7 + -1) != '\x02') goto LAB_001d8f7a;
      for (lVar7 = 0; lVar10 != lVar7; lVar7 = lVar7 + 1) {
        psVar4 = pIdxInfo->aConstraintUsage;
        psVar4[lVar7].argvIndex = 0;
        psVar4[lVar7].omit = '\0';
      }
      pIdxInfo->idxNum = 1;
      psVar4 = pIdxInfo->aConstraintUsage;
      psVar4[lVar10].argvIndex = 1;
      psVar4[lVar10].omit = '\x01';
      pIdxInfo->estimatedCost = 30.0;
      pIdxInfo->estimatedRows = 1;
      pIdxInfo->idxFlags = 1;
      goto LAB_001d9089;
    }
    if (cVar1 != '\0') {
LAB_001d8f7a:
      uVar6 = *(uint *)((long)psVar3 + lVar7 + -5);
      if ((int)uVar6 < 1) {
LAB_001d8fa0:
        if (*(char *)((long)psVar3 + lVar7 + -1) != '@') goto LAB_001d9023;
LAB_001d8fa8:
        uVar11 = '\x01';
        uVar9 = 0x46;
      }
      else {
LAB_001d8f96:
        if ((byte)tab[1].field_0xd < uVar6) goto LAB_001d8fa0;
        cVar1 = *(char *)((long)psVar3 + lVar7 + -1);
        if (cVar1 != '\x02') {
          if (cVar1 != '@') {
            if (cVar1 == '\b') {
              uVar11 = '\x01';
              uVar9 = 0x42;
            }
            else {
              if (cVar1 == '\x10') {
                uVar9 = 0x43;
              }
              else {
                if (cVar1 == ' ') {
                  uVar11 = '\x01';
                  uVar9 = 0x44;
                  goto LAB_001d8ffe;
                }
                if (cVar1 != '\x04') goto LAB_001d9023;
                uVar9 = 0x45;
              }
              uVar11 = '\0';
            }
            goto LAB_001d8ffe;
          }
          goto LAB_001d8fa8;
        }
        uVar11 = '\0';
        uVar9 = 0x41;
      }
LAB_001d8ffe:
      lVar12 = (long)iVar13;
      *(undefined1 *)((long)&local_68 + lVar12) = uVar9;
      iVar13 = iVar13 + 2;
      *(char *)((long)&local_68 + lVar12 + 1) = (char)uVar6 + '/';
      psVar4 = pIdxInfo->aConstraintUsage;
      psVar4[lVar10].argvIndex = iVar13 / 2;
      psVar4[lVar10].omit = uVar11;
    }
LAB_001d9023:
    lVar10 = lVar10 + 1;
    lVar7 = lVar7 + 0xc;
  }
  pIdxInfo->idxNum = 2;
  pIdxInfo->needToFreeIdxStr = 1;
  if (0 < iVar13) {
    __dest = (char *)sqlite3_malloc(iVar13 + 1U);
    pIdxInfo->idxStr = __dest;
    if (__dest == (char *)0x0) {
      iVar13 = 7;
      goto LAB_001d9090;
    }
    memcpy(__dest,&local_68,(ulong)(iVar13 + 1U));
  }
  lVar7 = *(long *)&tab[3].nRef >> ((byte)(iVar13 / 2) & 0x3f);
  pIdxInfo->estimatedCost = (double)lVar7 * 6.0;
  pIdxInfo->estimatedRows = lVar7;
LAB_001d9089:
  iVar13 = 0;
LAB_001d9090:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar13;
}

Assistant:

static int rtreeBestIndex(sqlite3_vtab *tab, sqlite3_index_info *pIdxInfo){
  Rtree *pRtree = (Rtree*)tab;
  int rc = SQLITE_OK;
  int ii;
  int bMatch = 0;                 /* True if there exists a MATCH constraint */
  i64 nRow;                       /* Estimated rows returned by this scan */

  int iIdx = 0;
  char zIdxStr[RTREE_MAX_DIMENSIONS*8+1];
  memset(zIdxStr, 0, sizeof(zIdxStr));

  /* Check if there exists a MATCH constraint - even an unusable one. If there
  ** is, do not consider the lookup-by-rowid plan as using such a plan would
  ** require the VDBE to evaluate the MATCH constraint, which is not currently
  ** possible. */
  for(ii=0; ii<pIdxInfo->nConstraint; ii++){
    if( pIdxInfo->aConstraint[ii].op==SQLITE_INDEX_CONSTRAINT_MATCH ){
      bMatch = 1;
    }
  }

  assert( pIdxInfo->idxStr==0 );
  for(ii=0; ii<pIdxInfo->nConstraint && iIdx<(int)(sizeof(zIdxStr)-1); ii++){
    struct sqlite3_index_constraint *p = &pIdxInfo->aConstraint[ii];

    if( bMatch==0 && p->usable
     && p->iColumn<=0 && p->op==SQLITE_INDEX_CONSTRAINT_EQ
    ){
      /* We have an equality constraint on the rowid. Use strategy 1. */
      int jj;
      for(jj=0; jj<ii; jj++){
        pIdxInfo->aConstraintUsage[jj].argvIndex = 0;
        pIdxInfo->aConstraintUsage[jj].omit = 0;
      }
      pIdxInfo->idxNum = 1;
      pIdxInfo->aConstraintUsage[ii].argvIndex = 1;
      pIdxInfo->aConstraintUsage[jj].omit = 1;

      /* This strategy involves a two rowid lookups on an B-Tree structures
      ** and then a linear search of an R-Tree node. This should be
      ** considered almost as quick as a direct rowid lookup (for which
      ** sqlite uses an internal cost of 0.0). It is expected to return
      ** a single row.
      */
      pIdxInfo->estimatedCost = 30.0;
      pIdxInfo->estimatedRows = 1;
      pIdxInfo->idxFlags = SQLITE_INDEX_SCAN_UNIQUE;
      return SQLITE_OK;
    }

    if( p->usable
    && ((p->iColumn>0 && p->iColumn<=pRtree->nDim2)
        || p->op==SQLITE_INDEX_CONSTRAINT_MATCH)
    ){
      u8 op;
      u8 doOmit = 1;
      switch( p->op ){
        case SQLITE_INDEX_CONSTRAINT_EQ:    op = RTREE_EQ;    doOmit = 0; break;
        case SQLITE_INDEX_CONSTRAINT_GT:    op = RTREE_GT;    doOmit = 0; break;
        case SQLITE_INDEX_CONSTRAINT_LE:    op = RTREE_LE;    break;
        case SQLITE_INDEX_CONSTRAINT_LT:    op = RTREE_LT;    doOmit = 0; break;
        case SQLITE_INDEX_CONSTRAINT_GE:    op = RTREE_GE;    break;
        case SQLITE_INDEX_CONSTRAINT_MATCH: op = RTREE_MATCH; break;
        default:                            op = 0;           break;
      }
      if( op ){
        zIdxStr[iIdx++] = op;
        zIdxStr[iIdx++] = (char)(p->iColumn - 1 + '0');
        pIdxInfo->aConstraintUsage[ii].argvIndex = (iIdx/2);
        pIdxInfo->aConstraintUsage[ii].omit = doOmit;
      }
    }
  }

  pIdxInfo->idxNum = 2;
  pIdxInfo->needToFreeIdxStr = 1;
  if( iIdx>0 ){
    pIdxInfo->idxStr = sqlite3_malloc( iIdx+1 );
    if( pIdxInfo->idxStr==0 ){
      return SQLITE_NOMEM;
    }
    memcpy(pIdxInfo->idxStr, zIdxStr, iIdx+1);
  }

  nRow = pRtree->nRowEst >> (iIdx/2);
  pIdxInfo->estimatedCost = (double)6.0 * (double)nRow;
  pIdxInfo->estimatedRows = nRow;

  return rc;
}